

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cpp
# Opt level: O2

void save_components_to_files
               (TRIPLERGB **mrx,BITMAPFILEHEADER bmFile,BITMAPINFOHEADER bmInfo,int format,
               char *filepath1,char *filepath2,char *filepath3)

{
  uchar uVar1;
  TRIPLERGB *pTVar2;
  undefined1 auVar3 [16];
  long lVar4;
  TRIPLERGB **matrix;
  TRIPLERGB **matrix_00;
  TRIPLERGB **matrix_01;
  TRIPLERGB *pTVar5;
  TRIPLERGB *pTVar6;
  TRIPLERGB *pTVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  size_t i;
  long lVar11;
  bool bVar12;
  
  lVar4 = (long)(int)bmInfo.biHeight;
  uVar10 = lVar4 * 8;
  if (lVar4 < 0) {
    uVar10 = 0xffffffffffffffff;
  }
  matrix = (TRIPLERGB **)operator_new__(uVar10);
  matrix_00 = (TRIPLERGB **)operator_new__(uVar10);
  matrix_01 = (TRIPLERGB **)operator_new__(uVar10);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)(int)bmInfo.biWidth;
  uVar10 = SUB168(auVar3 * ZEXT816(3),0);
  if (SUB168(auVar3 * ZEXT816(3),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  for (lVar11 = 0; lVar11 != lVar4; lVar11 = lVar11 + 1) {
    pTVar5 = (TRIPLERGB *)operator_new__(uVar10);
    matrix[lVar11] = pTVar5;
    pTVar6 = (TRIPLERGB *)operator_new__(uVar10);
    matrix_00[lVar11] = pTVar6;
    pTVar7 = (TRIPLERGB *)operator_new__(uVar10);
    matrix_01[lVar11] = pTVar7;
    lVar8 = 2;
    uVar9 = (long)(int)bmInfo.biWidth;
    while (bVar12 = uVar9 != 0, uVar9 = uVar9 - 1, bVar12) {
      if (format == 1) {
        pTVar2 = mrx[lVar11];
        uVar1 = (&pTVar2->blue)[lVar8];
        *(uchar *)((long)pTVar5 + lVar8 + -2) = uVar1;
        *(uchar *)((long)pTVar5 + lVar8 + -1) = uVar1;
        (&pTVar5->blue)[lVar8] = uVar1;
        uVar1 = *(uchar *)((long)pTVar2 + lVar8 + -1);
        *(uchar *)((long)pTVar6 + lVar8 + -2) = uVar1;
        *(uchar *)((long)pTVar6 + lVar8 + -1) = uVar1;
        (&pTVar6->blue)[lVar8] = uVar1;
        uVar1 = *(uchar *)((long)pTVar2 + lVar8 + -2);
        *(uchar *)((long)pTVar7 + lVar8 + -2) = uVar1;
        *(uchar *)((long)pTVar7 + lVar8 + -1) = uVar1;
        (&pTVar7->blue)[lVar8] = uVar1;
      }
      else if (format == 0) {
        pTVar2 = mrx[lVar11];
        (&pTVar5->blue)[lVar8] = (&pTVar2->blue)[lVar8];
        *(undefined1 *)((long)pTVar6 + lVar8 + -1) = *(undefined1 *)((long)pTVar2 + lVar8 + -1);
        *(undefined1 *)((long)pTVar7 + lVar8 + -2) = *(undefined1 *)((long)pTVar2 + lVar8 + -2);
      }
      lVar8 = lVar8 + 3;
    }
  }
  if ((uint)format < 2) {
    saveBMPFile(bmFile,bmInfo,matrix,filepath1);
    saveBMPFile(bmFile,bmInfo,matrix_00,filepath2);
    saveBMPFile(bmFile,bmInfo,matrix_01,filepath3);
  }
  uVar9 = 0;
  uVar10 = (ulong)bmInfo.biHeight;
  if ((int)bmInfo.biHeight < 1) {
    uVar10 = uVar9;
  }
  for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
    if (matrix[uVar9] != (TRIPLERGB *)0x0) {
      operator_delete__(matrix[uVar9]);
    }
    if (matrix_00[uVar9] != (TRIPLERGB *)0x0) {
      operator_delete__(matrix_00[uVar9]);
    }
    if (matrix_01[uVar9] != (TRIPLERGB *)0x0) {
      operator_delete__(matrix_01[uVar9]);
    }
  }
  operator_delete__(matrix);
  operator_delete__(matrix_00);
  operator_delete__(matrix_01);
  return;
}

Assistant:

void save_components_to_files(TRIPLERGB **mrx, BITMAPFILEHEADER bmFile, BITMAPINFOHEADER bmInfo, int format,
                              const char *filepath1, const char *filepath2, const char *filepath3) {
    int height = bmInfo.biHeight;
    int width = bmInfo.biWidth;
    TRIPLERGB **mrxA = new TRIPLERGB *[height];
    TRIPLERGB **mrxB = new TRIPLERGB *[height];
    TRIPLERGB **mrxC = new TRIPLERGB *[height];
    for (size_t i = 0; i < height; i++) {
        mrxA[i] = new TRIPLERGB[width];
        mrxB[i] = new TRIPLERGB[width];
        mrxC[i] = new TRIPLERGB[width];
        for (size_t j = 0; j < width; j++) {
            switch (format) {
                case FORMAT_RGB:
                    mrxA[i][j].red = mrx[i][j].red;
                    mrxB[i][j].green = mrx[i][j].green;
                    mrxC[i][j].blue = mrx[i][j].blue;
                    break;
                case FORMAT_YCBCR:
                    mrxA[i][j].red = mrxA[i][j].green = mrxA[i][j].blue = mrx[i][j].red;
                    mrxB[i][j].red = mrxB[i][j].green = mrxB[i][j].blue = mrx[i][j].green;
                    mrxC[i][j].red = mrxC[i][j].green = mrxC[i][j].blue = mrx[i][j].blue;
                    break;
                default:
                    break;
            }
        }
    }
    switch (format) {
        case FORMAT_RGB:
            saveBMPFile(bmFile, bmInfo, mrxA, filepath1);
            saveBMPFile(bmFile, bmInfo, mrxB, filepath2);
            saveBMPFile(bmFile, bmInfo, mrxC, filepath3);
            break;
        case FORMAT_YCBCR:
            saveBMPFile(bmFile, bmInfo, mrxA, filepath1);
            saveBMPFile(bmFile, bmInfo, mrxB, filepath2);
            saveBMPFile(bmFile, bmInfo, mrxC, filepath3);
            break;
        default:
            break;
    }
    for (int i = 0; i < height; i++) {
        delete[] mrxA[i];
        delete[] mrxB[i];
        delete[] mrxC[i];
    }
    delete[] mrxA;
    delete[] mrxB;
    delete[] mrxC;
}